

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlSubstitutionItem::LhsPrettyPrint
          (GdlSubstitutionItem *this,GrcManager *param_1,GdlRule *param_2,int param_3,
          ostream *strmOut,bool param_5)

{
  string local_30;
  
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_
            (&local_30,(this->super_GdlSetAttrItem).super_GdlRuleItem.m_psymInput);
  std::__ostream_insert<char,std::char_traits<char>>
            (strmOut,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"  ",2);
  return;
}

Assistant:

void GdlSubstitutionItem::LhsPrettyPrint(GrcManager * /*pcman*/, GdlRule * /*prule*/, int /*irit*/,
	std::ostream & strmOut, bool /*fXml*/)
{
	strmOut << m_psymInput->FullAbbrev();
	strmOut << "  ";
}